

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bignum.cc
# Opt level: O0

void TestShiftLeft(void)

{
  Bignum bignum;
  char buffer [1024];
  undefined4 in_stack_fffffffffffff9e8;
  int in_stack_fffffffffffff9ec;
  Bignum *in_stack_fffffffffffff9f0;
  Chunk in_stack_fffffffffffff9f8;
  Chunk in_stack_fffffffffffff9fc;
  char *in_stack_fffffffffffffa00;
  Chunk in_stack_fffffffffffffa08;
  Chunk in_stack_fffffffffffffa0c;
  Bignum *in_stack_fffffffffffffa10;
  Chunk in_stack_fffffffffffffa1c;
  char *in_stack_fffffffffffffa20;
  Bignum *in_stack_fffffffffffffa28;
  
  double_conversion::Bignum::Bignum((Bignum *)&stack0xfffffffffffff9f4);
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::ShiftLeft(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  CheckHelper(in_stack_fffffffffffffa00,in_stack_fffffffffffff9fc,(char *)in_stack_fffffffffffff9f0,
              SUB41((uint)in_stack_fffffffffffff9ec >> 0x18,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
                    in_stack_fffffffffffffa00,
                    (char *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
                    (char *)in_stack_fffffffffffff9f0,
                    (char *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::ShiftLeft(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  CheckHelper(in_stack_fffffffffffffa00,in_stack_fffffffffffff9fc,(char *)in_stack_fffffffffffff9f0,
              SUB41((uint)in_stack_fffffffffffff9ec >> 0x18,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
                    in_stack_fffffffffffffa00,
                    (char *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
                    (char *)in_stack_fffffffffffff9f0,
                    (char *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::ShiftLeft(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  CheckHelper(in_stack_fffffffffffffa00,in_stack_fffffffffffff9fc,(char *)in_stack_fffffffffffff9f0,
              SUB41((uint)in_stack_fffffffffffff9ec >> 0x18,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
                    in_stack_fffffffffffffa00,
                    (char *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
                    (char *)in_stack_fffffffffffff9f0,
                    (char *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::ShiftLeft(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  CheckHelper(in_stack_fffffffffffffa00,in_stack_fffffffffffff9fc,(char *)in_stack_fffffffffffff9f0,
              SUB41((uint)in_stack_fffffffffffff9ec >> 0x18,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
                    in_stack_fffffffffffffa00,
                    (char *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
                    (char *)in_stack_fffffffffffff9f0,
                    (char *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::ShiftLeft(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  CheckHelper(in_stack_fffffffffffffa00,in_stack_fffffffffffff9fc,(char *)in_stack_fffffffffffff9f0,
              SUB41((uint)in_stack_fffffffffffff9ec >> 0x18,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
                    in_stack_fffffffffffffa00,
                    (char *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
                    (char *)in_stack_fffffffffffff9f0,
                    (char *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::ShiftLeft(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  CheckHelper(in_stack_fffffffffffffa00,in_stack_fffffffffffff9fc,(char *)in_stack_fffffffffffff9f0,
              SUB41((uint)in_stack_fffffffffffff9ec >> 0x18,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
                    in_stack_fffffffffffffa00,
                    (char *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
                    (char *)in_stack_fffffffffffff9f0,
                    (char *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
  double_conversion::Bignum::ShiftLeft(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  CheckHelper(in_stack_fffffffffffffa00,in_stack_fffffffffffff9fc,(char *)in_stack_fffffffffffff9f0,
              SUB41((uint)in_stack_fffffffffffff9ec >> 0x18,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
                    in_stack_fffffffffffffa00,
                    (char *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
                    (char *)in_stack_fffffffffffff9f0,
                    (char *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
  return;
}

Assistant:

TEST(ShiftLeft) {
  char buffer[kBufferSize];
  Bignum bignum;
  AssignHexString(&bignum, "0");
  bignum.ShiftLeft(100);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("0", buffer);

  AssignHexString(&bignum, "1");
  bignum.ShiftLeft(1);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("2", buffer);

  AssignHexString(&bignum, "1");
  bignum.ShiftLeft(4);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("10", buffer);

  AssignHexString(&bignum, "1");
  bignum.ShiftLeft(32);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("100000000", buffer);

  AssignHexString(&bignum, "1");
  bignum.ShiftLeft(64);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("10000000000000000", buffer);

  AssignHexString(&bignum, "123456789ABCDEF");
  bignum.ShiftLeft(64);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("123456789ABCDEF0000000000000000", buffer);
  bignum.ShiftLeft(1);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("2468ACF13579BDE0000000000000000", buffer);
}